

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkLock::IntFromDescriptor
          (ChLinkLock *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  pointer ppCVar1;
  ChConstraintTwoBodies *pCVar2;
  ChLinkLimit *pCVar3;
  long lVar4;
  undefined4 in_register_00000034;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar5 = CONCAT44(in_register_00000034,off_v);
  lVar4 = (long)(this->mask).super_ChLinkMask.nconstr;
  if (0 < lVar4) {
    ppCVar1 = (this->mask).super_ChLinkMask.constraints.
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    v = (ChStateDelta *)
        (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar5 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    lVar6 = 0;
    iVar7 = 0;
    do {
      if ((this->mask).super_ChLinkMask.nconstr <= lVar6) {
        __assert_fail("(i >= 0) && (i < nconstr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMask.h"
                      ,0x37,"ChConstraintTwoBodies &chrono::ChLinkMask::Constr_N(int)");
      }
      pCVar2 = ppCVar1[lVar6];
      if ((pCVar2->super_ChConstraintTwo).super_ChConstraint.active == true) {
        if (lVar5 <= (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
        (&(v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        [iVar7 + off_L] = (double *)(pCVar2->super_ChConstraintTwo).super_ChConstraint.l_i;
        iVar7 = iVar7 + 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  iVar7 = (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
            super_ChObj._vptr_ChObj[0x19])(this,lVar5,v);
  pCVar3 = (this->limit_X)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if ((pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
    if ((pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
  }
  pCVar3 = (this->limit_Y)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if ((pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
    if ((pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
  }
  pCVar3 = (this->limit_Z)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if ((pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
    if ((pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
  }
  pCVar3 = (this->limit_Rx)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if ((pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
    if ((pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
  }
  pCVar3 = (this->limit_Ry)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if ((pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
    if ((pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
  }
  pCVar3 = (this->limit_Rz)._M_t.
           super___uniq_ptr_impl<chrono::ChLinkLimit,_std::default_delete<chrono::ChLinkLimit>_>.
           _M_t.
           super__Tuple_impl<0UL,_chrono::ChLinkLimit_*,_std::default_delete<chrono::ChLinkLimit>_>.
           super__Head_base<0UL,_chrono::ChLinkLimit_*,_false>._M_head_impl;
  if ((pCVar3 != (ChLinkLimit *)0x0) && (pCVar3->m_active == true)) {
    if ((pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) goto LAB_005921a8;
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_lower).super_ChConstraintTwo.super_ChConstraint.l_i;
      iVar7 = iVar7 + 1;
    }
    if ((pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.active == true) {
      if ((L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
          (long)(ulong)(iVar7 + off_L)) {
LAB_005921a8:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [iVar7 + off_L] = (pCVar3->constr_upper).super_ChConstraintTwo.super_ChConstraint.l_i;
    }
  }
  return;
}

Assistant:

void ChLinkLock::IntFromDescriptor(const unsigned int off_v,
                                   ChStateDelta& v,
                                   const unsigned int off_L,
                                   ChVectorDynamic<>& L) {
    int cnt = 0;
    for (int i = 0; i < mask.nconstr; i++) {
        if (mask.Constr_N(i).IsActive()) {
            L(off_L + cnt) = mask.Constr_N(i).Get_l_i();
            cnt++;
        }
    }

    int local_offset = this->GetDOC_c();

    if (limit_X && limit_X->IsActive()) {
        if (limit_X->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_X->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_X->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_X->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Y && limit_Y->IsActive()) {
        if (limit_Y->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Y->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Y->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Y->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Z && limit_Z->IsActive()) {
        if (limit_Z->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Z->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Z->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Z->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Rx && limit_Rx->IsActive()) {
        if (limit_Rx->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Rx->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Rx->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Rx->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Ry && limit_Ry->IsActive()) {
        if (limit_Ry->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Ry->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Ry->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Ry->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
    if (limit_Rz && limit_Rz->IsActive()) {
        if (limit_Rz->constr_lower.IsActive()) {
            L(off_L + local_offset) = limit_Rz->constr_lower.Get_l_i();
            ++local_offset;
        }
        if (limit_Rz->constr_upper.IsActive()) {
            L(off_L + local_offset) = limit_Rz->constr_upper.Get_l_i();
            ++local_offset;
        }
    }
}